

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.h
# Opt level: O0

qreal __thiscall
QTextBlockFormat::lineHeight(QTextBlockFormat *this,qreal scriptLineHeight,qreal scaling)

{
  int iVar1;
  double *pdVar2;
  QTextFormat *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qreal qVar3;
  double in_XMM1_Qa;
  undefined8 in_stack_ffffffffffffffb8;
  int propertyId;
  double local_20;
  double local_18;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  propertyId = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_10 = in_XMM0_Qa;
  iVar1 = QTextFormat::intProperty(in_RDI,propertyId);
  switch(iVar1) {
  case 0:
    local_20 = local_10;
    break;
  case 1:
    qVar3 = QTextFormat::doubleProperty(in_RDI,(int)((ulong)local_10 >> 0x20));
    local_20 = (local_10 * qVar3) / 100.0;
    break;
  case 2:
    qVar3 = QTextFormat::doubleProperty(in_RDI,propertyId);
    local_20 = qVar3 * in_XMM1_Qa;
    break;
  case 3:
    qVar3 = QTextFormat::doubleProperty(in_RDI,propertyId);
    local_18 = qVar3 * in_XMM1_Qa;
    pdVar2 = qMax<double>(&local_10,&local_18);
    local_20 = *pdVar2;
    break;
  case 4:
    qVar3 = QTextFormat::doubleProperty(in_RDI,propertyId);
    local_20 = qVar3 * in_XMM1_Qa + local_10;
    break;
  default:
    local_20 = 0.0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

inline qreal QTextBlockFormat::lineHeight(qreal scriptLineHeight, qreal scaling = 1.0) const
{
  switch(intProperty(LineHeightType)) {
    case SingleHeight:
      return(scriptLineHeight);
    case ProportionalHeight:
      return(scriptLineHeight * doubleProperty(LineHeight) / 100.0);
    case FixedHeight:
      return(doubleProperty(LineHeight) * scaling);
    case MinimumHeight:
      return(qMax(scriptLineHeight, doubleProperty(LineHeight) * scaling));
    case LineDistanceHeight:
      return(scriptLineHeight + doubleProperty(LineHeight) * scaling);
  }
  return(0);
}